

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

void __thiscall
ON_BinaryArchive::SetModelSerialNumber
          (ON_BinaryArchive *this,uint model_serial_number,uint reference_model_serial_number,
          uint instance_definition_model_serial_number)

{
  this->m_SetModelComponentSerialNumbers = true;
  this->m_model_serial_number = model_serial_number;
  this->m_reference_model_serial_number = reference_model_serial_number;
  this->m_instance_definition_model_serial_number = instance_definition_model_serial_number;
  if (instance_definition_model_serial_number != 0 || reference_model_serial_number != 0) {
    this->m_bCheckForRemappedIds = true;
  }
  return;
}

Assistant:

void ON_BinaryArchive::SetModelSerialNumber(
  unsigned int model_serial_number,
  unsigned int reference_model_serial_number,
  unsigned int instance_definition_model_serial_number
  )
{
  m_SetModelComponentSerialNumbers = true;
  m_model_serial_number = model_serial_number;
  m_reference_model_serial_number = reference_model_serial_number;
  m_instance_definition_model_serial_number = instance_definition_model_serial_number;
  if (0 != m_reference_model_serial_number || 0 != m_instance_definition_model_serial_number)
    m_bCheckForRemappedIds = true;
}